

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O1

void __thiscall icu_63::UVector32::sortedInsert(UVector32 *this,int32_t tok,UErrorCode *ec)

{
  int iVar1;
  int32_t *piVar2;
  UBool UVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar1 = this->count;
  if (iVar1 == 0) {
    iVar7 = 0;
  }
  else {
    iVar7 = 0;
    iVar5 = iVar1;
    do {
      iVar6 = (iVar7 + iVar5) / 2;
      if (this->elements[iVar6] <= tok) {
        iVar7 = iVar6 + 1;
        iVar6 = iVar5;
      }
      iVar5 = iVar6;
    } while (iVar7 != iVar5);
  }
  if (((-2 < iVar1) && (iVar1 < this->capacity)) ||
     (UVar3 = expandCapacity(this,iVar1 + 1,ec), UVar3 != '\0')) {
    lVar4 = (long)this->count;
    if (iVar7 < this->count) {
      piVar2 = this->elements;
      do {
        piVar2[lVar4] = piVar2[lVar4 + -1];
        lVar4 = lVar4 + -1;
      } while (iVar7 < lVar4);
    }
    this->elements[iVar7] = tok;
    this->count = this->count + 1;
  }
  return;
}

Assistant:

void UVector32::sortedInsert(int32_t tok, UErrorCode& ec) {
    // Perform a binary search for the location to insert tok at.  Tok
    // will be inserted between two elements a and b such that a <=
    // tok && tok < b, where there is a 'virtual' elements[-1] always
    // less than tok and a 'virtual' elements[count] always greater
    // than tok.
    int32_t min = 0, max = count;
    while (min != max) {
        int32_t probe = (min + max) / 2;
        //int8_t c = (*compare)(elements[probe], tok);
        //if (c > 0) {
        if (elements[probe] > tok) {
            max = probe;
        } else {
            // assert(c <= 0);
            min = probe + 1;
        }
    }
    if (ensureCapacity(count + 1, ec)) {
        for (int32_t i=count; i>min; --i) {
            elements[i] = elements[i-1];
        }
        elements[min] = tok;
        ++count;
    }
}